

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_send_reset_query(rtr_socket *rtr_socket)

{
  int iVar1;
  long in_FS_OFFSET;
  rtr_socket *rtr_socket_local;
  undefined1 local_18;
  undefined1 local_17;
  undefined2 local_16;
  undefined4 local_14;
  pdu_reset_query pdu;
  
  pdu = *(pdu_reset_query *)(in_FS_OFFSET + 0x28);
  lrtr_dbg("RTR Socket: Sending reset query");
  local_18 = (undefined1)rtr_socket->version;
  local_17 = 2;
  local_16 = 0;
  local_14 = 8;
  iVar1 = rtr_send_pdu(rtr_socket,&local_18,8);
  if (iVar1 == 0) {
    rtr_socket_local._4_4_ = 0;
  }
  else {
    rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
    rtr_socket_local._4_4_ = -1;
  }
  if (*(pdu_reset_query *)(in_FS_OFFSET + 0x28) == pdu) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_send_reset_query(struct rtr_socket *rtr_socket)
{
	RTR_DBG1("Sending reset query");
	struct pdu_reset_query pdu;

	pdu.ver = rtr_socket->version;
	pdu.type = 2;
	pdu.flags = 0;
	pdu.len = 8;

	if (rtr_send_pdu(rtr_socket, &pdu, sizeof(pdu)) != RTR_SUCCESS) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	}
	return RTR_SUCCESS;
}